

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Flip
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  EVP_PKEY_CTX *src;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  long lVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong uVar13;
  ImageTemplate<unsigned_char> local_58;
  
  uVar4 = (ulong)startXOut;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if (horizontal || vertical) {
    uVar2 = in->_rowSize;
    uVar13 = (ulong)uVar2;
    uVar3 = out->_rowSize;
    uVar7 = (ulong)uVar3;
    puVar11 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2);
    uVar10 = (ulong)(uVar2 * height);
    puVar6 = puVar11 + uVar10;
    if (horizontal && !vertical) {
      if (uVar10 != 0) {
        puVar5 = out->_data + ((ulong)width - 1) + uVar4 + startYOut * uVar3;
        do {
          if (width != 0) {
            lVar8 = 0;
            puVar9 = puVar11;
            do {
              uVar1 = *puVar9;
              puVar9 = puVar9 + 1;
              puVar5[lVar8] = uVar1;
              lVar8 = lVar8 + -1;
            } while (-lVar8 != (ulong)width);
          }
          puVar11 = puVar11 + uVar13;
          puVar5 = puVar5 + uVar7;
        } while (puVar11 != puVar6);
      }
    }
    else if (vertical && !horizontal) {
      if (uVar10 != 0) {
        uVar12 = 0;
        puVar6 = out->_data + uVar4 + ((startYOut - 1) + height) * uVar3;
        do {
          memcpy(puVar6,puVar11 + uVar12,(ulong)width);
          puVar6 = puVar6 + -uVar7;
          uVar12 = uVar12 + uVar13;
        } while (uVar10 != uVar12);
      }
    }
    else if (uVar10 != 0) {
      puVar5 = out->_data + ((ulong)width - 1) + uVar4 + ((startYOut - 1) + height) * uVar3;
      do {
        if (width != 0) {
          lVar8 = 0;
          puVar9 = puVar11;
          do {
            uVar1 = *puVar9;
            puVar9 = puVar9 + 1;
            puVar5[lVar8] = uVar1;
            lVar8 = lVar8 + -1;
          } while (-lVar8 != (ulong)width);
        }
        puVar11 = puVar11 + uVar13;
        puVar5 = puVar5 + -uVar7;
      } while (puVar11 != puVar6);
    }
  }
  else {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            if( horizontal && !vertical ) {
                uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
            else if( !horizontal && vertical ) {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                    memcpy( outY, inY, sizeof( uint8_t ) * width );
            }
            else {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }